

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-slice.cc
# Opt level: O2

TextSlice * __thiscall
TextSlice::prefix(TextSlice *__return_storage_ptr__,TextSlice *this,uint32_t prefix_end)

{
  pair<TextSlice,_TextSlice> local_40;
  
  split(&local_40,this,prefix_end);
  __return_storage_ptr__->end_position = local_40.first.end_position;
  __return_storage_ptr__->text = local_40.first.text;
  __return_storage_ptr__->start_position = local_40.first.start_position;
  return __return_storage_ptr__;
}

Assistant:

TextSlice TextSlice::prefix(uint32_t prefix_end) const {
  return split(prefix_end).first;
}